

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptConstantBufferType(HlslGrammar *this,TType *type)

{
  TTypeList *userDef;
  bool bVar1;
  TType *this_00;
  long lVar2;
  pool_allocator<char> local_148;
  TString local_140;
  TTypeList *local_118;
  TTypeList *typeList;
  TQualifier postDeclQualifier;
  undefined1 local_b8 [8];
  TType templateType;
  TType *type_local;
  HlslGrammar *this_local;
  
  templateType.spirvType = (TSpirvType *)type;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokConstantBuffer);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      TType::TType((TType *)local_b8,EbtVoid,EvqTemporary,1,0,0,false);
      bVar1 = acceptType(this,(TType *)local_b8);
      if (bVar1) {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) {
          TQualifier::clear((TQualifier *)&typeList);
          postDeclQualifier.semanticName =
               (char *)((ulong)postDeclQualifier.semanticName & 0xffffffffffffff80 | 5);
          bVar1 = TType::isStruct((TType *)local_b8);
          if (bVar1) {
            local_118 = TType::getWritableStruct((TType *)local_b8);
            this_00 = (TType *)TType::operator_new(0x98,templateType.spirvType);
            userDef = local_118;
            pool_allocator<char>::pool_allocator(&local_148);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_140,"",&local_148);
            TType::TType(this_00,userDef,&local_140,(TQualifier *)&typeList);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_140);
            lVar2 = (**(code **)&(((templateType.spirvType)->spirvInst).set._M_dataplus.
                                  super_allocator_type.allocator)->numCalls)();
            *(ulong *)(lVar2 + 8) = *(ulong *)(lVar2 + 8) & 0xffffffffffffff80 | 5;
            this_local._7_1_ = true;
          }
          else {
            (*(this->parseContext->super_TParseContextBase).super_TParseVersions.
              _vptr_TParseVersions[0x2d])
                      (this->parseContext,&(this->super_HlslTokenStream).token,
                       "non-structure type in ConstantBuffer","");
            this_local._7_1_ = false;
          }
        }
        else {
          expected(this,"right angle bracket");
          this_local._7_1_ = false;
        }
      }
      else {
        expected(this,"type");
        this_local._7_1_ = false;
      }
      postDeclQualifier._76_4_ = 1;
      TType::~TType((TType *)local_b8);
    }
    else {
      expected(this,"left angle bracket");
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptConstantBufferType(TType& type)
{
    if (! acceptTokenClass(EHTokConstantBuffer))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        expected("left angle bracket");
        return false;
    }
    
    TType templateType;
    if (! acceptType(templateType)) {
        expected("type");
        return false;
    }

    if (! acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    TQualifier postDeclQualifier;
    postDeclQualifier.clear();
    postDeclQualifier.storage = EvqUniform;

    if (templateType.isStruct()) {
        // Make a block from the type parsed as the template argument
        TTypeList* typeList = templateType.getWritableStruct();
        new(&type) TType(typeList, "", postDeclQualifier); // sets EbtBlock

        type.getQualifier().storage = EvqUniform;

        return true;
    } else {
        parseContext.error(token.loc, "non-structure type in ConstantBuffer", "", "");
        return false;
    }
}